

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeUnknownMessageSetItemsToArray
                    (UnknownFieldSet *unknown_fields,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  const_reference this;
  uint8_t *ptr;
  uint uVar5;
  byte *pbVar6;
  
  iVar2 = SooRep::size((SooRep *)unknown_fields,
                       (undefined1  [16])
                       ((undefined1  [16])(unknown_fields->fields_).soo_rep_.field_0 &
                       (undefined1  [16])0x4) == (undefined1  [16])0x0);
  if (0 < iVar2) {
    iVar2 = 0;
    do {
      this = RepeatedField<google::protobuf::UnknownField>::Get(&unknown_fields->fields_,iVar2);
      if (this->type_ == 3) {
        if (stream->end_ <= target) {
          target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        target[0] = '\v';
        target[1] = '\x10';
        pbVar6 = target + 2;
        uVar4 = this->number_;
        uVar5 = uVar4;
        if (0x7f < uVar4) {
          do {
            *pbVar6 = (byte)uVar5 | 0x80;
            uVar4 = uVar5 >> 7;
            pbVar6 = pbVar6 + 1;
            bVar1 = 0x3fff < uVar5;
            uVar5 = uVar4;
          } while (bVar1);
        }
        *pbVar6 = (byte)uVar4;
        pbVar6[1] = 0x1a;
        ptr = UnknownField::InternalSerializeLengthDelimitedNoTag(this,pbVar6 + 2,stream);
        if (stream->end_ <= ptr) {
          ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
        }
        *ptr = '\f';
        target = ptr + 1;
      }
      iVar2 = iVar2 + 1;
      iVar3 = SooRep::size((SooRep *)unknown_fields,
                           (undefined1  [16])
                           ((undefined1  [16])(unknown_fields->fields_).soo_rep_.field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
    } while (iVar2 < iVar3);
  }
  return target;
}

Assistant:

uint8_t* WireFormat::InternalSerializeUnknownMessageSetItemsToArray(
    const UnknownFieldSet& unknown_fields, uint8_t* target,
    io::EpsCopyOutputStream* stream) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      target = stream->EnsureSpace(target);
      // Start group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemStartTag, target);

      // Write type ID.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetTypeIdTag, target);
      target =
          io::CodedOutputStream::WriteVarint32ToArray(field.number(), target);

      // Write message.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetMessageTag, target);

      target = field.InternalSerializeLengthDelimitedNoTag(target, stream);

      target = stream->EnsureSpace(target);
      // End group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemEndTag, target);
    }
  }

  return target;
}